

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_container_benchmark.c
# Opt level: O1

int unset_test(bitset_container_t *B)

{
  uint64_t *puVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  
  puVar1 = B->words;
  iVar3 = B->cardinality;
  uVar5 = 0xfffffffd;
  do {
    uVar4 = (int)uVar5 + 3;
    uVar5 = (ulong)uVar4;
    uVar2 = puVar1[uVar4 >> 6];
    iVar3 = iVar3 - (uint)((uVar2 >> (uVar5 & 0x3f) & 1) != 0);
    puVar1[uVar4 >> 6] = uVar2 & ~(1L << (uVar5 & 0x3f));
  } while (uVar4 < 0xfffd);
  B->cardinality = iVar3;
  return 0;
}

Assistant:

int unset_test(bitset_container_t* B) {
    int x;
    for (x = 0; x < 1 << 16; x += 3) {
        bitset_container_remove(B, (uint16_t)x);
    }
    return 0;
}